

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_shape_prepare_update(JSContext *ctx,JSObject *p,JSShapeProperty **pprs)

{
  JSShape *pJVar1;
  int iVar2;
  ulong uVar3;
  
  pJVar1 = p->shape;
  iVar2 = 0;
  if (pJVar1->is_hashed != '\0') {
    if ((pJVar1->header).ref_count == 1) {
      js_shape_hash_unlink(ctx->rt,pJVar1);
      pJVar1->is_hashed = '\0';
    }
    else {
      if (pprs == (JSShapeProperty **)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (ulong)((long)*pprs + (-0x40 - (long)pJVar1)) >> 3 & 0xffffffff;
      }
      pJVar1 = js_clone_shape(ctx,pJVar1);
      if (pJVar1 == (JSShape *)0x0) {
        iVar2 = -1;
      }
      else {
        js_free_shape(ctx->rt,p->shape);
        iVar2 = 0;
        p->shape = pJVar1;
        if (pprs != (JSShapeProperty **)0x0) {
          *pprs = (JSShapeProperty *)(&pJVar1[1].header.ref_count + uVar3 * 2);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int js_shape_prepare_update(JSContext *ctx, JSObject *p,
                                   JSShapeProperty **pprs)
{
    JSShape *sh;
    uint32_t idx = 0;    /* prevent warning */

    sh = p->shape;
    if (sh->is_hashed) {
        if (sh->header.ref_count != 1) {
            if (pprs)
                idx = *pprs - get_shape_prop(sh);
            /* clone the shape (the resulting one is no longer hashed) */
            sh = js_clone_shape(ctx, sh);
            if (!sh)
                return -1;
            js_free_shape(ctx->rt, p->shape);
            p->shape = sh;
            if (pprs)
                *pprs = get_shape_prop(sh) + idx;
        } else {
            js_shape_hash_unlink(ctx->rt, sh);
            sh->is_hashed = FALSE;
        }
    }
    return 0;
}